

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writekey.cpp
# Opt level: O0

int writekey_main(int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  undefined8 uVar3;
  DB *pDVar4;
  undefined8 uVar5;
  undefined8 *in_RSI;
  int in_EDI;
  Status status;
  string key;
  DB db;
  string path;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> value;
  string *in_stack_fffffffffffff5c8;
  DB *in_stack_fffffffffffff5d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff5d8;
  undefined7 in_stack_fffffffffffff5e0;
  undefined1 in_stack_fffffffffffff5e7;
  allocator<char> *in_stack_fffffffffffff600;
  DB *__stream;
  undefined7 in_stack_fffffffffffff608;
  undefined1 in_stack_fffffffffffff60f;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  string local_9e0 [8];
  basic_istream<char,_std::char_traits<char>_> *in_stack_fffffffffffff628;
  undefined1 local_9c0 [16];
  undefined1 local_9b0 [23];
  undefined1 local_999;
  Status local_998;
  undefined1 in_stack_fffffffffffff676;
  undefined1 in_stack_fffffffffffff677;
  char *in_stack_fffffffffffff678;
  DB *in_stack_fffffffffffff680;
  string *in_stack_fffffffffffff818;
  string_view in_stack_fffffffffffff820;
  allocator<char> local_71;
  string local_70 [32];
  string local_50 [32];
  string local_30 [32];
  undefined8 *local_10;
  uint local_4;
  
  local_10 = in_RSI;
  if ((in_EDI < 4) || (iVar2 = strcmp("help",(char *)in_RSI[1]), iVar2 == 0)) {
    printf("Usage: %s writekey <minecraft_world_dir> <key> < input.bin\n",*local_10);
    local_4 = 1;
  }
  else {
    mcberepair::slurp_string<char,std::char_traits<char>,std::allocator<char>>
              (in_stack_fffffffffffff628);
    this = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_10[2];
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (this,(char *)CONCAT17(in_stack_fffffffffffff60f,in_stack_fffffffffffff608),
               in_stack_fffffffffffff600);
    std::operator+(in_stack_fffffffffffff5d8,(char *)in_stack_fffffffffffff5d0);
    std::__cxx11::string::~string(local_70);
    std::allocator<char>::~allocator(&local_71);
    std::__cxx11::string::c_str();
    mcberepair::DB::DB(in_stack_fffffffffffff680,in_stack_fffffffffffff678,
                       (bool)in_stack_fffffffffffff677,(bool)in_stack_fffffffffffff676);
    bVar1 = mcberepair::DB::operator_cast_to_bool((DB *)0x10ce3e);
    if (bVar1) {
      std::__cxx11::string::string((string *)&stack0xfffffffffffff680);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)
                 CONCAT17(in_stack_fffffffffffff5e7,in_stack_fffffffffffff5e0),
                 (char *)in_stack_fffffffffffff5d8);
      bVar1 = mcberepair::decode_key(in_stack_fffffffffffff820,in_stack_fffffffffffff818);
      if (bVar1) {
        pDVar4 = mcberepair::DB::operator()((DB *)0x10cfd4);
        local_999 = 0;
        leveldb::Slice::Slice((Slice *)in_stack_fffffffffffff5d0,in_stack_fffffffffffff5c8);
        leveldb::Slice::Slice((Slice *)in_stack_fffffffffffff5d0,in_stack_fffffffffffff5c8);
        (*pDVar4->_vptr_DB[2])(&local_998,pDVar4,&local_999,local_9b0,local_9c0);
        bVar1 = leveldb::Status::ok(&local_998);
        if (!bVar1) {
          uVar3 = local_10[3];
          in_stack_fffffffffffff5d0 = _stderr;
          leveldb::Status::ToString_abi_cxx11_((Status *)in_stack_fffffffffffff628);
          uVar5 = std::__cxx11::string::c_str();
          fprintf((FILE *)in_stack_fffffffffffff5d0,"ERROR: Reading key \'%s\' failed: %s\n",uVar3,
                  uVar5);
          std::__cxx11::string::~string(local_9e0);
        }
        local_4 = (uint)!bVar1;
        leveldb::Status::~Status((Status *)in_stack_fffffffffffff5d0);
      }
      else {
        fprintf((FILE *)_stderr,"ERROR: key \'%s\' is malformed\n",local_10[3]);
        local_4 = 1;
      }
      std::__cxx11::string::~string((string *)&stack0xfffffffffffff680);
    }
    else {
      __stream = _stderr;
      uVar3 = std::__cxx11::string::c_str();
      fprintf((FILE *)__stream,"ERROR: Opening \'%s\' failed.\n",uVar3);
      local_4 = 1;
    }
    mcberepair::DB::~DB(in_stack_fffffffffffff5d0);
    std::__cxx11::string::~string(local_50);
    std::__cxx11::string::~string(local_30);
  }
  return local_4;
}

Assistant:

int writekey_main(int argc, char* argv[]) {
    if(argc < 4 || strcmp("help", argv[1]) == 0) {
        printf("Usage: %s writekey <minecraft_world_dir> <key> < input.bin\n",
               argv[0]);
        return EXIT_FAILURE;
    }

#ifdef _WIN32
    _setmode(_fileno(stdin), O_BINARY);
#endif

    // slurp from stdin into value before we open db
    auto value = mcberepair::slurp_string(std::cin);

    // construct path for Minecraft BE database
    std::string path = std::string(argv[2]) + "/db";

    // open the database
    mcberepair::DB db{path.c_str()};

    if(!db) {
        fprintf(stderr, "ERROR: Opening '%s' failed.\n", path.c_str());
        return EXIT_FAILURE;
    }

    std::string key;
    if(!mcberepair::decode_key(argv[3], &key)) {
        fprintf(stderr, "ERROR: key '%s' is malformed\n", argv[3]);
        return EXIT_FAILURE;
    }

    leveldb::Status status = db().Put({}, key, value);

    if(!status.ok()) {
        // LCOV_EXCL_START
        fprintf(stderr, "ERROR: Reading key '%s' failed: %s\n", argv[3],
                status.ToString().c_str());
        return EXIT_FAILURE;
        // LCOV_EXCL_STOP
    }

    return EXIT_SUCCESS;
}